

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::NativeColorMappingTests::init(NativeColorMappingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"native_window",
             "Tests for mapping client color to native window");
  anon_unknown_0::addTestGroups((this->super_TestCaseGroup).m_eglTestCtx,pTVar1,NATIVETYPE_WINDOW);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"native_pixmap",
             "Tests for mapping client color to native pixmap");
  anon_unknown_0::addTestGroups((this->super_TestCaseGroup).m_eglTestCtx,pTVar1,NATIVETYPE_PIXMAP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_to_native_pixmap",
             "Tests for mapping client color to native pixmap with eglCopyBuffers()");
  anon_unknown_0::addTestGroups
            ((this->super_TestCaseGroup).m_eglTestCtx,pTVar1,NATIVETYPE_PBUFFER_COPY_TO_PIXMAP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void NativeColorMappingTests::init (void)
{
	{
		TestCaseGroup* windowGroup = new TestCaseGroup(m_eglTestCtx, "native_window", "Tests for mapping client color to native window");
		addTestGroups(m_eglTestCtx, windowGroup, NativeColorMappingCase::NATIVETYPE_WINDOW);
		addChild(windowGroup);
	}

	{
		TestCaseGroup* pixmapGroup = new TestCaseGroup(m_eglTestCtx, "native_pixmap", "Tests for mapping client color to native pixmap");
		addTestGroups(m_eglTestCtx, pixmapGroup, NativeColorMappingCase::NATIVETYPE_PIXMAP);
		addChild(pixmapGroup);
	}

	{
		TestCaseGroup* pbufferGroup = new TestCaseGroup(m_eglTestCtx, "pbuffer_to_native_pixmap", "Tests for mapping client color to native pixmap with eglCopyBuffers()");
		addTestGroups(m_eglTestCtx, pbufferGroup, NativeColorMappingCase::NATIVETYPE_PBUFFER_COPY_TO_PIXMAP);
		addChild(pbufferGroup);
	}
}